

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_model.cc
# Opt level: O0

EncodeResult * __thiscall sentencepiece::word::Model::Encode(Model *this,string_view normalized)

{
  bool bVar1;
  undefined4 uVar2;
  char *in_RCX;
  size_t in_RDX;
  long *in_RSI;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  bool in_stack_0000004e;
  bool in_stack_0000004f;
  string_view in_stack_00000050;
  basic_string_view<char,_std::char_traits<char>_> *w;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  EncodeResult *output;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff28;
  reference in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff3c;
  byte bVar3;
  undefined1 uVar4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_70;
  size_t local_68;
  char *pcStack_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined1 local_35;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this_00 = in_RDI;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = util::Status::ok((Status *)0x495071);
  bVar3 = true;
  if (bVar1) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  }
  uVar4 = bVar3;
  util::Status::~Status((Status *)0x4950ae);
  if ((bVar3 & 1) == 0) {
    local_35 = 0;
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)0x495110);
    local_68 = local_18._M_len;
    pcStack_60 = local_18._M_str;
    SplitIntoWords(in_stack_00000050,in_stack_0000004f,in_stack_0000004e);
    local_40 = local_58;
    local_70._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin(in_stack_ffffffffffffff28);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::end(in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      in_stack_ffffffffffffff30 =
           __gnu_cxx::
           __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ::operator*(&local_70);
      uVar2 = (**(code **)(*in_RSI + 0x70))
                        (in_RSI,in_stack_ffffffffffffff30->_M_len,in_stack_ffffffffffffff30->_M_str)
      ;
      std::
      vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int>
                ((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  *)this_00,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(uVar4,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff3c,uVar2))),
                 (int *)in_stack_ffffffffffffff30);
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&local_70);
    }
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector(this_00);
  }
  else {
    memset(this_00,0,0x18);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)0x4950d3);
  }
  return (EncodeResult *)in_RDI;
}

Assistant:

EncodeResult Model::Encode(absl::string_view normalized) const {
  if (!status().ok() || normalized.empty()) {
    return {};
  }

  EncodeResult output;
  for (const auto &w : SplitIntoWords(normalized)) {
    output.emplace_back(w, PieceToId(w));
  }

  return output;
}